

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O0

bool __thiscall Entity::hit(Entity *this,int damage)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_00000010;
  
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) - in_ESI;
  *(undefined4 *)(in_RDI + 0x28) = 500;
  bVar1 = *(int *)(in_RDI + 0x20) < 1;
  if (bVar1) {
    explode((Entity *)CONCAT44(damage,in_stack_00000010));
  }
  return bVar1;
}

Assistant:

bool Entity::hit(int damage)
{
   hp -= damage;

   hilightCount = 500;

   if (hp <= 0) {
      explode();
      return true;
   }

   return false;
}